

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void __thiscall MidiInAlsa::openVirtualPort(MidiInAlsa *this,string *portName)

{
  undefined8 *puVar1;
  pointer pcVar2;
  pthread_t __thread1;
  pthread_t __thread2;
  char *pcVar3;
  size_type sVar4;
  int iVar5;
  undefined4 uVar6;
  long lVar7;
  size_t __n;
  undefined1 *__s;
  undefined8 uVar8;
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  pthread_attr_t attr;
  undefined8 local_60;
  string local_50;
  
  __s = local_a8;
  puVar1 = (undefined8 *)(this->super_MidiInApi).super_MidiApi.apiData_;
  if (*(int *)((long)puVar1 + 0xc) < 0) {
    uStack_b0 = 0x10dfbb;
    lVar7 = snd_seq_port_info_sizeof();
    lVar7 = -(lVar7 + 0xfU & 0xfffffffffffffff0);
    __s = local_a8 + lVar7;
    *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10dfd1;
    __n = snd_seq_port_info_sizeof();
    *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10dfde;
    memset(__s,0,__n);
    *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10dfeb;
    snd_seq_port_info_set_capability(__s,0x42);
    *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10dff8;
    snd_seq_port_info_set_type(__s,0x100002);
    *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10e005;
    snd_seq_port_info_set_midi_channels(__s,0x10);
    *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10e012;
    snd_seq_port_info_set_timestamping(__s,1);
    *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10e01f;
    snd_seq_port_info_set_timestamp_real(__s,1);
    uVar6 = *(undefined4 *)(puVar1 + 9);
    *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10e02b;
    snd_seq_port_info_set_timestamp_queue(__s,uVar6);
    pcVar2 = (portName->_M_dataplus)._M_p;
    *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10e036;
    snd_seq_port_info_set_name(__s,pcVar2);
    uVar8 = *puVar1;
    *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10e042;
    iVar5 = snd_seq_create_port(uVar8);
    *(int *)((long)puVar1 + 0xc) = iVar5;
    if (iVar5 < 0) {
      pcVar3 = (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
      *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10e1a0;
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,pcVar3,0x110cd6);
      pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
      sVar4 = (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
      attr._48_8_ = &stack0xffffffffffffffa0;
      *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10e1bf;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(attr.__size + 0x30),pcVar2,pcVar2 + sVar4);
      *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10e1cf;
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,(string *)(attr.__size + 0x30));
      uVar8 = attr._48_8_;
      if ((undefined8 *)attr._48_8_ == &stack0xffffffffffffffa0) {
        return;
      }
      goto LAB_0010e1dc;
    }
    *(undefined8 *)(local_a8 + lVar7 + -8) = 0x10e056;
    uVar6 = snd_seq_port_info_get_port(__s);
    *(undefined4 *)((long)puVar1 + 0xc) = uVar6;
  }
  if ((this->super_MidiInApi).inputData_.doInput != false) {
    return;
  }
  __thread1 = puVar1[6];
  __thread2 = puVar1[7];
  *(undefined8 *)(__s + -8) = 0x10e07f;
  iVar5 = pthread_equal(__thread1,__thread2);
  if (iVar5 == 0) {
    *(undefined8 *)(__s + -8) = 0x10e08d;
    pthread_join(__thread1,(void **)0x0);
  }
  uVar8 = *puVar1;
  uVar6 = *(undefined4 *)(puVar1 + 9);
  *(undefined8 *)(__s + -8) = 0x10e0a4;
  snd_seq_control_queue(uVar8,uVar6,0x1e,0,0);
  uVar8 = *puVar1;
  *(undefined8 *)(__s + -8) = 0x10e0ad;
  snd_seq_drain_output(uVar8);
  *(undefined8 *)(__s + -8) = 0x10e0bc;
  pthread_attr_init((pthread_attr_t *)local_a8);
  *(undefined8 *)(__s + -8) = 0x10e0c6;
  pthread_attr_setdetachstate((pthread_attr_t *)local_a8,0);
  *(undefined8 *)(__s + -8) = 0x10e0d0;
  pthread_attr_setschedpolicy((pthread_attr_t *)local_a8,0);
  (this->super_MidiInApi).inputData_.doInput = true;
  *(undefined8 *)(__s + -8) = 0x10e0ec;
  iVar5 = pthread_create(puVar1 + 6,(pthread_attr_t *)local_a8,alsaMidiHandler,
                         &(this->super_MidiInApi).inputData_);
  *(undefined8 *)(__s + -8) = 0x10e0f7;
  pthread_attr_destroy((pthread_attr_t *)local_a8);
  if (iVar5 == 0) {
    return;
  }
  if (puVar1[2] != 0) {
    uVar8 = *puVar1;
    *(undefined8 *)(__s + -8) = 0x10e112;
    snd_seq_unsubscribe_port(uVar8);
    uVar8 = puVar1[2];
    *(undefined8 *)(__s + -8) = 0x10e11b;
    snd_seq_port_subscribe_free(uVar8);
    puVar1[2] = 0;
  }
  (this->super_MidiInApi).inputData_.doInput = false;
  pcVar3 = (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
  *(undefined8 *)(__s + -8) = 0x10e146;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,pcVar3,0x110c9e);
  pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
  sVar4 = (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  *(undefined8 *)(__s + -8) = 0x10e165;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar2 + sVar4);
  *(undefined8 *)(__s + -8) = 0x10e175;
  MidiApi::error((MidiApi *)this,THREAD_ERROR,&local_50);
  local_60 = local_50.field_2._M_allocated_capacity;
  uVar8 = local_50._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    return;
  }
LAB_0010e1dc:
  *(undefined8 *)(__s + -8) = 0x10e1e4;
  operator_delete((void *)uVar8,local_60 + 1);
  return;
}

Assistant:

void MidiInAlsa :: openVirtualPort( const std::string &portName )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( data->vport < 0 ) {
    snd_seq_port_info_t *pinfo;
    snd_seq_port_info_alloca( &pinfo );
    snd_seq_port_info_set_capability( pinfo,
                                      SND_SEQ_PORT_CAP_WRITE |
                                      SND_SEQ_PORT_CAP_SUBS_WRITE );
    snd_seq_port_info_set_type( pinfo,
                                SND_SEQ_PORT_TYPE_MIDI_GENERIC |
                                SND_SEQ_PORT_TYPE_APPLICATION );
    snd_seq_port_info_set_midi_channels( pinfo, 16 );
#ifndef AVOID_TIMESTAMPING
    snd_seq_port_info_set_timestamping( pinfo, 1 );
    snd_seq_port_info_set_timestamp_real( pinfo, 1 );
    snd_seq_port_info_set_timestamp_queue( pinfo, data->queue_id );
#endif
    snd_seq_port_info_set_name( pinfo, portName.c_str() );
    data->vport = snd_seq_create_port( data->seq, pinfo );

    if ( data->vport < 0 ) {
      errorString_ = "MidiInAlsa::openVirtualPort: ALSA error creating virtual port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    data->vport = snd_seq_port_info_get_port( pinfo );
  }

  if ( inputData_.doInput == false ) {
    // Wait for old thread to stop, if still running
    if ( !pthread_equal( data->thread, data->dummy_thread_id ) )
      pthread_join( data->thread, NULL );

    // Start the input queue
#ifndef AVOID_TIMESTAMPING
    snd_seq_start_queue( data->seq, data->queue_id, NULL );
    snd_seq_drain_output( data->seq );
#endif
    // Start our MIDI input thread.
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );

    inputData_.doInput = true;
    int err = pthread_create( &data->thread, &attr, alsaMidiHandler, &inputData_ );
    pthread_attr_destroy( &attr );
    if ( err ) {
      if ( data->subscription ) {
        snd_seq_unsubscribe_port( data->seq, data->subscription );
        snd_seq_port_subscribe_free( data->subscription );
        data->subscription = 0;
      }
      inputData_.doInput = false;
      errorString_ = "MidiInAlsa::openPort: error starting MIDI input thread!";
      error( RtMidiError::THREAD_ERROR, errorString_ );
      return;
    }
  }
}